

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  undefined4 uVar1;
  undefined4 uVar2;
  cmdline_parser_arg_type arg_type;
  char *pcVar3;
  bool bVar4;
  gengetopt_args_info *pgVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  size_t sVar12;
  char **ppcVar13;
  uint uVar14;
  uint *prev_given;
  ulong uVar15;
  uint *field_given;
  char cVar16;
  option *poVar17;
  char *pcVar18;
  short string_arg;
  char *pcVar19;
  uint uVar20;
  double *field;
  generic_list **list;
  cmdline_parser_arg_type arg_type_00;
  undefined8 in_R9;
  option *poVar21;
  option *poVar22;
  custom_getopt_data *pcVar23;
  uint uVar24;
  size_t sVar25;
  uint uVar27;
  ulong uVar28;
  custom_getopt_data *pcVar29;
  char cVar30;
  int in_stack_fffffffffffffd4c;
  int iVar31;
  undefined4 in_stack_fffffffffffffd58;
  uint local_2a0;
  generic_list *molFraction_list;
  generic_list *shellRadius_list;
  int local_254;
  gengetopt_args_info *local_250;
  custom_getopt_data *local_248;
  double *local_240;
  uint *local_238;
  uint *local_230;
  custom_getopt_data *local_228;
  double *local_220;
  uint *local_218;
  uint *local_210;
  custom_getopt_data *local_208;
  double *local_200;
  uint *local_1f8;
  uint *local_1f0;
  custom_getopt_data *local_1e8;
  double *local_1e0;
  uint *local_1d8;
  uint *local_1d0;
  custom_getopt_data *local_1c8;
  double *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  custom_getopt_data *local_1a8;
  double *local_1a0;
  uint *local_198;
  uint *local_190;
  custom_getopt_data *local_188;
  char **local_180;
  uint *local_178;
  uint *local_170;
  gengetopt_args_info local_168;
  custom_getopt_data *pcVar26;
  
  shellRadius_list = (generic_list *)0x0;
  molFraction_list = (generic_list *)0x0;
  package_name = *argv;
  arg_type = params->override;
  local_254 = params->check_required;
  uVar20 = params->check_ambiguity;
  pcVar19 = (char *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_168);
  local_238 = &args_info->vacancyOuterRadius_given;
  local_230 = &local_168.vacancyOuterRadius_given;
  local_218 = &args_info->vacancyInnerRadius_given;
  local_210 = &local_168.vacancyInnerRadius_given;
  local_1f8 = &args_info->vacancyPercent_given;
  local_1f0 = &local_168.vacancyPercent_given;
  local_1d8 = &args_info->length_given;
  local_1d0 = &local_168.length_given;
  local_1b8 = &args_info->radius_given;
  local_1b0 = &local_168.radius_given;
  local_198 = &args_info->latticeConstant_given;
  local_190 = &local_168.latticeConstant_given;
  local_178 = &args_info->output_given;
  local_170 = &local_168.output_given;
  uVar9 = (ulong)(uint)argc;
  local_240 = &args_info->vacancyOuterRadius_arg;
  local_248 = (custom_getopt_data *)&args_info->vacancyOuterRadius_orig;
  local_220 = &args_info->vacancyInnerRadius_arg;
  local_228 = (custom_getopt_data *)&args_info->vacancyInnerRadius_orig;
  local_200 = &args_info->vacancyPercent_arg;
  local_208 = (custom_getopt_data *)&args_info->vacancyPercent_orig;
  local_1e0 = &args_info->length_arg;
  local_1e8 = (custom_getopt_data *)&args_info->length_orig;
  local_1c0 = &args_info->radius_arg;
  local_1c8 = (custom_getopt_data *)&args_info->radius_orig;
  local_1a0 = &args_info->latticeConstant_arg;
  local_1a8 = (custom_getopt_data *)&args_info->latticeConstant_orig;
  local_180 = &args_info->output_arg;
  local_188 = (custom_getopt_data *)&args_info->output_orig;
  pcVar29 = (custom_getopt_data *)0x0;
  uVar28 = 0;
  iVar8 = params->print_errors;
  uVar24 = argc;
  local_250 = args_info;
LAB_0012b73b:
  custom_opterr = iVar8;
  arg_type_00 = (cmdline_parser_arg_type)in_R9;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (uint)uVar28;
  uVar27 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  iVar8 = custom_opterr;
  if (argc < 1) goto LAB_0012bfed;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
  custom_optarg = (char *)pcVar29;
  if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
     ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
    }
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
         _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
         _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012b7d1:
    if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
        (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
        (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
    }
    else {
      exchange(argv,(custom_getopt_data *)pcVar19);
    }
    arg_type_00 = (cmdline_parser_arg_type)in_R9;
    uVar28 = (ulong)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    uVar27 = argc;
    if (argc < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
      uVar27 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    uVar15 = uVar9;
    if ((long)uVar9 < (long)uVar28) {
      uVar15 = uVar28;
    }
    for (; local_2a0 = (uint)uVar15, _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar27,
        (long)uVar28 < (long)uVar9; uVar28 = uVar28 + 1) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = (uint)uVar28;
      if ((*argv[uVar28] == '-') &&
         (local_2a0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, argv[uVar28][1] != '\0')
         ) break;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
    }
    uVar14 = argc;
    if ((((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) ||
         (pcVar3 = argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7],
         uVar14 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, *pcVar3 != '-')) ||
        (pcVar3[1] != '-')) || (pcVar3[2] != '\0')) {
      if (local_2a0 != argc) {
        lVar10 = (long)(int)local_2a0;
        pcVar29 = (custom_getopt_data *)argv[lVar10];
        if ((*(char *)&pcVar29->custom_optind != '-') ||
           (cVar30 = *(char *)((long)&pcVar29->custom_optind + 1), cVar30 == '\0')) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
          pcVar26 = (custom_getopt_data *)0x1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar29;
          goto LAB_0012c20d;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
             (custom_getopt_data *)((long)&pcVar29->custom_optind + (ulong)(cVar30 == '-') + 1);
        argc = uVar24;
        goto LAB_0012b8d6;
      }
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
      uVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        exchange(argv,(custom_getopt_data *)pcVar19);
        uVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar20;
      uVar28 = (ulong)(uint)argc;
      uVar14 = argc;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = argc;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
    }
    uVar27 = (uint)uVar28;
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != uVar14) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      uVar27 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
    }
    goto LAB_0012bfed;
  }
  if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
     (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0'))
  goto LAB_0012b7d1;
  lVar10 = (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  argc = uVar24;
  local_2a0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012b8d6:
  pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
  pcVar3 = argv[lVar10];
  if (pcVar3[1] == '-') {
    for (sVar25 = 0;
        (cVar30 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                   custom_optind + sVar25), cVar30 != '\0' && (cVar30 != '='));
        sVar25 = sVar25 + 1) {
    }
    bVar4 = false;
    in_stack_fffffffffffffd4c = 0;
    poVar21 = (option *)0x0;
    iVar7 = -1;
    for (poVar17 = cmdline_parser_internal::long_options; pcVar18 = poVar17->name,
        pcVar18 != (char *)0x0; poVar17 = poVar17 + 1) {
      pcVar19 = (char *)pcVar29;
      iVar6 = strncmp(pcVar18,(char *)pcVar29,sVar25);
      poVar22 = poVar21;
      iVar31 = iVar7;
      if (iVar6 == 0) {
        sVar12 = strlen(pcVar18);
        if ((int)sVar12 == (int)sVar25) goto LAB_0012ba46;
        poVar22 = poVar17;
        iVar31 = in_stack_fffffffffffffd4c;
        if ((poVar21 != (option *)0x0) &&
           (((iVar31 = iVar7, poVar21->has_arg != poVar17->has_arg ||
             (poVar21->flag != poVar17->flag)) || (poVar22 = poVar21, poVar21->val != poVar17->val))
           )) {
          bVar4 = true;
          poVar22 = poVar21;
        }
      }
      in_stack_fffffffffffffd4c = in_stack_fffffffffffffd4c + 1;
      poVar21 = poVar22;
      iVar7 = iVar31;
    }
    if (bVar4) {
      if (iVar8 != 0) {
        pcVar19 = "%s: option `%s\' is ambiguous\n";
        fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar3);
        local_2a0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      }
      sVar25 = strlen((char *)pcVar29);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
           (custom_getopt_data *)((long)&pcVar29->custom_optind + sVar25);
LAB_0012bf09:
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
    }
    else {
      poVar17 = poVar21;
      in_stack_fffffffffffffd4c = iVar7;
      if (poVar21 == (option *)0x0) {
        if (iVar8 != 0) {
          pcVar19 = "%s: unrecognized option `--%s\'\n";
          fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar29);
          local_2a0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x24d2fb;
        goto LAB_0012bf09;
      }
LAB_0012ba46:
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
      uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (*(char *)((long)&pcVar29->custom_optind + sVar25) == '\0') {
        if (poVar17->has_arg == 1) {
          if (argc <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            if (iVar8 != 0) {
              pcVar19 = "%s: option `%s\' requires an argument\n";
              fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar3);
              pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            }
            sVar25 = strlen((char *)pcVar29);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar29->custom_optind + sVar25);
            goto LAB_0012bf7c;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
               (custom_getopt_data *)argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0]
          ;
          uVar28 = (ulong)(local_2a0 + 2);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 2;
        }
LAB_0012baa3:
        cVar30 = -0x55;
        sVar25 = strlen((char *)pcVar29);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
             (custom_getopt_data *)((long)&pcVar29->custom_optind + sVar25);
        pcVar26 = (custom_getopt_data *)(ulong)(uint)poVar17->val;
        if ((uint *)poVar17->flag == (uint *)0x0) goto LAB_0012bb8a;
        *poVar17->flag = poVar17->val;
        uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar8 = custom_opterr;
        goto LAB_0012bc07;
      }
      if (poVar17->has_arg != 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
             (custom_getopt_data *)((long)&pcVar29->custom_optind + sVar25 + 1);
        goto LAB_0012baa3;
      }
      if (iVar8 != 0) {
        if (pcVar3[1] == '-') {
          pcVar19 = "%s: option `--%s\' doesn\'t allow an argument\n";
          fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,poVar17->name);
        }
        else {
          pcVar19 = "%s: option `%c%s\' doesn\'t allow an argument\n";
          fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                  (ulong)(uint)(int)*pcVar3,poVar17->name);
        }
      }
      pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      sVar25 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
           (custom_getopt_data *)((long)&pcVar29->custom_optind + sVar25);
    }
LAB_0012bf7c:
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    goto LAB_0012bf8a;
  }
  pcVar23 = (custom_getopt_data *)
            ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
  cVar16 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
  uVar24 = (uint)cVar16;
  pcVar26 = (custom_getopt_data *)(ulong)uVar24;
  cVar30 = ' ';
  pcVar19 = (char *)pcVar26;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar23;
  pvVar11 = memchr("hVo:",uVar24,5);
  if (*(char *)((long)&pcVar29->custom_optind + 1) == '\0') {
    local_2a0 = local_2a0 + 1;
    uVar28 = (ulong)local_2a0;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0;
  }
  if ((pvVar11 == (void *)0x0) || (cVar16 == ':')) {
    if (iVar8 != 0) {
      pcVar19 = "%s: invalid option -- %c\n";
      fprintf(_stderr,"%s: invalid option -- %c\n",*argv,pcVar26);
    }
    goto LAB_0012bf7c;
  }
  if (*(char *)((long)pvVar11 + 1) == ':') {
    if (*(char *)((long)pvVar11 + 2) == ':') {
      if (*(char *)&pcVar23->custom_optind == '\0') {
        pcVar23 = (custom_getopt_data *)0x0;
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
        uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      in_stack_fffffffffffffd4c = 0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
    }
    else {
      if (*(char *)&pcVar23->custom_optind == '\0') {
        if (local_2a0 == argc) {
          in_stack_fffffffffffffd4c = 0;
          cVar16 = '?';
          if (iVar8 == 0) {
            iVar8 = 0;
          }
          else {
            pcVar19 = "%s: option requires an argument -- %c\n";
            cVar30 = '`';
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar24);
            uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            iVar8 = custom_opterr;
          }
        }
        else {
          in_stack_fffffffffffffd4c = 0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
          uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
               (custom_getopt_data *)argv[(int)local_2a0];
        }
      }
      else {
        in_stack_fffffffffffffd4c = 0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_2a0 + 1;
        uVar28 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
      pcVar26 = (custom_getopt_data *)(ulong)(uint)(int)cVar16;
    }
  }
  else {
    in_stack_fffffffffffffd4c = 0;
  }
LAB_0012bb8a:
  pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
  arg_type_00 = (cmdline_parser_arg_type)in_R9;
  uVar27 = (uint)uVar28;
  custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
  iVar7 = (int)pcVar26;
  if (iVar7 == 0) {
LAB_0012bc07:
    pcVar29 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    pcVar3 = cmdline_parser_internal::long_options[in_stack_fffffffffffffd4c].name;
    iVar31 = 0x240d4b;
    cVar30 = ')';
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar7 = strcmp(pcVar3,"latticeConstant");
    prev_given = local_190;
    field_given = local_198;
    pcVar19 = (char *)local_1a8;
    field = local_1a0;
    uVar24 = argc;
    if (iVar7 != 0) {
      iVar31 = 0x24af62;
      cVar30 = 'H';
      iVar7 = strcmp(pcVar3,"radius");
      prev_given = local_1b0;
      field_given = local_1b8;
      pcVar19 = (char *)local_1c8;
      field = local_1c0;
      if (iVar7 != 0) {
        iVar31 = 0x24808f;
        cVar30 = 'b';
        iVar7 = strcmp(pcVar3,"length");
        prev_given = local_1d0;
        field_given = local_1d8;
        pcVar19 = (char *)local_1e8;
        field = local_1e0;
        if (iVar7 != 0) {
          pcVar18 = "shellRadius";
          iVar7 = strcmp(pcVar3,"shellRadius");
          if (iVar7 == 0) {
            list = &shellRadius_list;
            pcVar19 = (char *)&local_168.shellRadius_given;
LAB_0012bddd:
            iVar7 = update_multiple_arg_temp
                              (list,(uint *)pcVar19,(char *)pcVar29,(char **)pcVar18,
                               additional_error,(cmdline_parser_arg_type)in_R9,
                               (char *)CONCAT44(in_stack_fffffffffffffd4c,iVar8),
                               (char)additional_error,
                               (char *)CONCAT44(uVar24,in_stack_fffffffffffffd58));
            goto joined_r0x0012bdb6;
          }
          pcVar18 = "molFraction";
          iVar7 = strcmp(pcVar3,"molFraction");
          if (iVar7 == 0) {
            list = &molFraction_list;
            pcVar19 = (char *)&local_168.molFraction_given;
            goto LAB_0012bddd;
          }
          iVar31 = 0x240d73;
          cVar30 = -0x50;
          iVar7 = strcmp(pcVar3,"vacancyPercent");
          prev_given = local_1f0;
          field_given = local_1f8;
          pcVar19 = (char *)local_208;
          field = local_200;
          if (iVar7 != 0) {
            iVar31 = 0x240d82;
            cVar30 = -0x36;
            iVar7 = strcmp(pcVar3,"vacancyInnerRadius");
            prev_given = local_210;
            field_given = local_218;
            pcVar19 = (char *)local_228;
            field = local_220;
            if (iVar7 == 0) goto LAB_0012bd9f;
            pcVar19 = "vacancyOuterRadius";
            cVar30 = -0x1f;
            iVar7 = strcmp(pcVar3,"vacancyOuterRadius");
            if (iVar7 != 0) goto LAB_0012b73b;
            iVar31 = 0x240d95;
            prev_given = local_230;
            field_given = local_238;
            pcVar19 = (char *)local_248;
            field = local_240;
          }
        }
      }
    }
LAB_0012bd9f:
    in_R9 = 2;
    iVar7 = update_arg(field,(char **)pcVar19,field_given,prev_given,(char *)pcVar29,(char **)0x2,
                       (char *)(ulong)uVar20,arg_type,0,0,iVar31,0x2d,additional_error,cVar30,
                       (char *)CONCAT44(in_stack_fffffffffffffd4c,iVar8));
  }
  else {
    if (iVar7 != 0x6f) {
      if (iVar7 == -1) {
LAB_0012bfed:
        pgVar5 = local_250;
        custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        update_multiple_arg(&local_250->shellRadius_arg,&local_250->shellRadius_orig,
                            local_250->shellRadius_given,local_168.shellRadius_given,
                            &shellRadius_list->arg,arg_type_00,
                            (generic_list *)CONCAT44(in_stack_fffffffffffffd4c,iVar8));
        update_multiple_arg(&pgVar5->molFraction_arg,&pgVar5->molFraction_orig,
                            pgVar5->molFraction_given,local_168.molFraction_given,
                            &molFraction_list->arg,arg_type_00,
                            (generic_list *)CONCAT44(in_stack_fffffffffffffd4c,iVar8));
        uVar20 = local_168.shellRadius_given;
        local_168.shellRadius_given = 0;
        uVar1 = pgVar5->shellRadius_given;
        uVar2 = pgVar5->molFraction_given;
        pgVar5->shellRadius_given = uVar1 + uVar20;
        pgVar5->molFraction_given = uVar2 + local_168.molFraction_given;
        local_168.molFraction_given = 0;
        if (local_254 == 0) {
          cmdline_parser_release(&local_168);
        }
        else {
          iVar8 = cmdline_parser_required2(pgVar5,*argv,additional_error);
          cmdline_parser_release(&local_168);
          if (iVar8 != 0) {
            return 1;
          }
        }
        pgVar5 = local_250;
        uVar20 = argc - uVar27;
        if (uVar20 != 0 && (int)uVar27 <= argc) {
          local_250->inputs_num = uVar20;
          ppcVar13 = (char **)malloc((ulong)uVar20 << 3);
          pgVar5->inputs = ppcVar13;
          for (lVar10 = 0; (int)uVar27 + lVar10 < (long)argc; lVar10 = lVar10 + 1) {
            pcVar19 = gengetopt_strdup(argv[(int)uVar27 + lVar10]);
            pgVar5->inputs[lVar10] = pcVar19;
          }
          return 0;
        }
        return 0;
      }
      if (iVar7 != 0x3f) {
        if (iVar7 == 0x56) {
          cmdline_parser_print_version();
        }
        else {
          if (iVar7 != 0x68) {
LAB_0012c20d:
            pcVar19 = "";
            if (additional_error != (char *)0x0) {
              pcVar19 = additional_error;
            }
            custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
            fprintf(_stderr,"%s: option unknown: %c%s\n","nanorod_pentBuilder",pcVar26,pcVar19);
            abort();
          }
          cmdline_parser_print_help();
        }
        cmdline_parser_free(&local_168);
        exit(0);
      }
      goto LAB_0012bf8a;
    }
    in_R9 = 1;
    pcVar19 = (char *)local_188;
    iVar7 = update_arg(local_180,(char **)local_188,local_178,local_170,
                       (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,(char **)0x1,
                       (char *)(ulong)uVar20,arg_type,0,0,0x240d44,0x6f,additional_error,cVar30,
                       (char *)CONCAT44(in_stack_fffffffffffffd4c,iVar8));
    uVar24 = argc;
  }
joined_r0x0012bdb6:
  if (iVar7 != 0) {
LAB_0012bf8a:
    string_arg = (short)pcVar19;
    free_list(shellRadius_list,string_arg);
    free_list(molFraction_list,string_arg);
    cmdline_parser_release(&local_168);
    return 1;
  }
  goto LAB_0012b73b;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * shellRadius_list = NULL;
  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "latticeConstant",	1, NULL, 0 },
        { "radius",	1, NULL, 0 },
        { "length",	1, NULL, 0 },
        { "shellRadius",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "vacancyPercent",	1, NULL, 0 },
        { "vacancyInnerRadius",	1, NULL, 0 },
        { "vacancyOuterRadius",	1, NULL, 0 },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* Lattice spacing in Angstroms for cubic lattice..  */
          if (strcmp (long_options[option_index].name, "latticeConstant") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->latticeConstant_arg), 
                 &(args_info->latticeConstant_orig), &(args_info->latticeConstant_given),
                &(local_args_info.latticeConstant_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "latticeConstant", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod radius in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "radius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->radius_arg), 
                 &(args_info->radius_orig), &(args_info->radius_given),
                &(local_args_info.radius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "radius", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod length in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "length") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->length_arg), 
                 &(args_info->length_orig), &(args_info->length_given),
                &(local_args_info.length_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "length", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius containing within it only molecules of a specific component. Specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "shellRadius") == 0)
          {
          
            if (update_multiple_arg_temp(&shellRadius_list, 
                &(local_args_info.shellRadius_given), optarg, 0, 0, ARG_DOUBLE,
                "shellRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Builds a multi-component random alloy nanoparticle. A mole Fraction must be specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          /* Percentage of atoms to remove from within vacancy range.  */
          else if (strcmp (long_options[option_index].name, "vacancyPercent") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyPercent_arg), 
                 &(args_info->vacancyPercent_orig), &(args_info->vacancyPercent_given),
                &(local_args_info.vacancyPercent_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyPercent", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyInnerRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyInnerRadius_arg), 
                 &(args_info->vacancyInnerRadius_orig), &(args_info->vacancyInnerRadius_given),
                &(local_args_info.vacancyInnerRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyInnerRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyOuterRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyOuterRadius_arg), 
                 &(args_info->vacancyOuterRadius_orig), &(args_info->vacancyOuterRadius_given),
                &(local_args_info.vacancyOuterRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyOuterRadius", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->shellRadius_arg),
    &(args_info->shellRadius_orig), args_info->shellRadius_given,
    local_args_info.shellRadius_given, 0,
    ARG_DOUBLE, shellRadius_list);
  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->shellRadius_given += local_args_info.shellRadius_given;
  local_args_info.shellRadius_given = 0;
  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (shellRadius_list, 0 );
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}